

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
          *other)

{
  undefined8 *puVar1;
  long lVar2;
  ulong size_00;
  long lVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 *puVar6;
  Index index;
  ulong uVar7;
  long lVar8;
  Index size;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar2 = *(long *)(other + 0x10);
  if (lVar2 != 0) {
    auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
    if (SUB168(auVar4 / SEXT816(lVar2),0) < 1) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8,lVar2,SUB168(auVar4 % SEXT816(lVar2),0));
      *puVar6 = std::ios::widen;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if (lVar2 < 0) goto LAB_0010c0b9;
  }
  DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar2,lVar2,1);
  lVar2 = *(long *)other;
  size_00 = *(ulong *)(other + 0x10);
  if (*(ulong *)(this + 8) != size_00) {
    if ((long)size_00 < 0) {
LAB_0010c0b9:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,size_00,size_00,1);
    if (*(ulong *)(this + 8) != size_00) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2eb,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  lVar3 = *(long *)this;
  uVar7 = size_00 - ((long)size_00 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)size_00) {
    lVar8 = 0;
    do {
      puVar6 = (undefined8 *)(lVar2 + lVar8 * 8);
      uVar5 = puVar6[1];
      puVar1 = (undefined8 *)(lVar3 + lVar8 * 8);
      *puVar1 = *puVar6;
      puVar1[1] = uVar5;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < (long)size_00) {
    do {
      *(undefined8 *)(lVar3 + uVar7 * 8) = *(undefined8 *)(lVar2 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (size_00 != uVar7);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }